

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O0

void __thiscall dg::vr::ValueRelations::erasePlaceholderBucket(ValueRelations *this,Handle h)

{
  bool bVar1;
  pointer ppVar2;
  reference ppVVar3;
  map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
  *this_00;
  long in_RDI;
  V val;
  iterator __end2;
  iterator __begin2;
  VectorSet<const_llvm::Value_*> *__range2;
  iterator found;
  Bucket *in_stack_ffffffffffffff98;
  map<const_llvm::Value_*,_std::reference_wrapper<const_dg::vr::Bucket>,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
  *in_stack_ffffffffffffffa0;
  Bucket *in_stack_ffffffffffffffb8;
  RelationsGraph<dg::vr::ValueRelations> *in_stack_ffffffffffffffc0;
  __normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
  local_30;
  VectorSet<const_llvm::Value_*> *local_28;
  _Base_ptr local_18;
  
  std::reference_wrapper<dg::vr::Bucket_const>::
  reference_wrapper<dg::vr::Bucket_const&,void,dg::vr::Bucket_const*>
            ((reference_wrapper<const_dg::vr::Bucket> *)in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98);
  local_18 = (_Base_ptr)
             std::
             map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
             ::find((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
                     *)in_stack_ffffffffffffff98,(key_type *)0x209bb1);
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>
           ::operator->((_Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>
                         *)0x209bc0);
  local_28 = &ppVar2->second;
  local_30._M_current =
       (Value **)
       VectorSet<const_llvm::Value_*>::begin
                 ((VectorSet<const_llvm::Value_*> *)in_stack_ffffffffffffff98);
  VectorSet<const_llvm::Value_*>::end((VectorSet<const_llvm::Value_*> *)in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                        *)in_stack_ffffffffffffffa0,
                       (__normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) break;
    ppVVar3 = __gnu_cxx::
              __normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
              ::operator*(&local_30);
    in_stack_ffffffffffffffc0 = (RelationsGraph<dg::vr::ValueRelations> *)*ppVVar3;
    std::
    map<const_llvm::Value_*,_std::reference_wrapper<const_dg::vr::Bucket>,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
    ::erase(in_stack_ffffffffffffffa0,(key_type *)in_stack_ffffffffffffff98);
    __gnu_cxx::
    __normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
    ::operator++(&local_30);
  }
  this_00 = (map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
             *)(in_RDI + 0x88);
  std::reference_wrapper<dg::vr::Bucket_const>::
  reference_wrapper<dg::vr::Bucket_const&,void,dg::vr::Bucket_const*>
            ((reference_wrapper<const_dg::vr::Bucket> *)this_00,in_stack_ffffffffffffff98);
  std::
  map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
  ::erase(this_00,(key_type *)in_stack_ffffffffffffff98);
  RelationsGraph<dg::vr::ValueRelations>::erase(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8)
  ;
  return;
}

Assistant:

void ValueRelations::erasePlaceholderBucket(Handle h) {
    auto found = bucketToVals.find(h);
    assert(found != bucketToVals.end());
    for (V val : found->second) {
        assert(valToBucket.find(val) != valToBucket.end() &&
               valToBucket.at(val) == h);
        valToBucket.erase(val);
    }
    bucketToVals.erase(h);
    graph.erase(h);
}